

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_dec.c
# Opt level: O2

int ExportAlphaRGBA4444(WebPDecParams *p,int y_pos,int max_lines_out)

{
  WEBP_CSP_MODE WVar1;
  uint uVar2;
  WebPDecBuffer *pWVar3;
  uint8_t *puVar4;
  byte bVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  WebPRescaler *wrk;
  byte bVar11;
  uint8_t *puVar12;
  
  pWVar3 = p->output;
  wrk = p->scaler_a;
  puVar4 = (pWVar3->u).RGBA.rgba;
  lVar7 = (long)(pWVar3->u).RGBA.stride;
  lVar8 = y_pos * lVar7;
  puVar12 = puVar4 + lVar8 + 1;
  WVar1 = pWVar3->colorspace;
  uVar2 = wrk->dst_width;
  iVar9 = 0;
  uVar10 = 0;
  if (0 < (int)uVar2) {
    uVar10 = (ulong)uVar2;
  }
  bVar11 = 0xf;
  for (; ((wrk->dst_y < wrk->dst_height && (wrk->y_accum < 1)) && (iVar9 < max_lines_out));
      iVar9 = iVar9 + 1) {
    WebPRescalerExportRow(wrk);
    for (uVar6 = 0; uVar10 != uVar6; uVar6 = uVar6 + 1) {
      bVar5 = p->scaler_a->dst[uVar6] >> 4;
      puVar12[uVar6 * 2] = puVar12[uVar6 * 2] & 0xf0 | bVar5;
      bVar11 = bVar11 & bVar5;
    }
    lVar7 = (long)(pWVar3->u).RGBA.stride;
    puVar12 = puVar12 + lVar7;
    wrk = p->scaler_a;
  }
  if ((WVar1 - MODE_rgbA < 4) && (bVar11 != 0xf)) {
    (*WebPApplyAlphaMultiply4444)(puVar4 + lVar8,uVar2,iVar9,(int)lVar7);
  }
  return iVar9;
}

Assistant:

static int ExportAlphaRGBA4444(WebPDecParams* const p, int y_pos,
                               int max_lines_out) {
  const WebPRGBABuffer* const buf = &p->output->u.RGBA;
  uint8_t* const base_rgba = buf->rgba + (size_t)y_pos * buf->stride;
#if (WEBP_SWAP_16BIT_CSP == 1)
  uint8_t* alpha_dst = base_rgba;
#else
  uint8_t* alpha_dst = base_rgba + 1;
#endif
  int num_lines_out = 0;
  const WEBP_CSP_MODE colorspace = p->output->colorspace;
  const int width = p->scaler_a->dst_width;
  const int is_premult_alpha = WebPIsPremultipliedMode(colorspace);
  uint32_t alpha_mask = 0x0f;

  while (WebPRescalerHasPendingOutput(p->scaler_a) &&
         num_lines_out < max_lines_out) {
    int i;
    assert(y_pos + num_lines_out < p->output->height);
    WebPRescalerExportRow(p->scaler_a);
    for (i = 0; i < width; ++i) {
      // Fill in the alpha value (converted to 4 bits).
      const uint32_t alpha_value = p->scaler_a->dst[i] >> 4;
      alpha_dst[2 * i] = (alpha_dst[2 * i] & 0xf0) | alpha_value;
      alpha_mask &= alpha_value;
    }
    alpha_dst += buf->stride;
    ++num_lines_out;
  }
  if (is_premult_alpha && alpha_mask != 0x0f) {
    WebPApplyAlphaMultiply4444(base_rgba, width, num_lines_out, buf->stride);
  }
  return num_lines_out;
}